

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getaddrinfo.c
# Opt level: O0

void uv__getaddrinfo_done(uv__work *w,int status)

{
  undefined8 uVar1;
  int in_ESI;
  long in_RDI;
  addrinfo *res;
  uv_getaddrinfo_t *req;
  
  if (*(long *)(in_RDI + -8) + 0x20 == *(long *)(*(long *)(in_RDI + -8) + 0x20)) {
    __assert_fail("uv__has_active_reqs(req->loop)","src/unix/getaddrinfo.c",0x2d,
                  "void uv__getaddrinfo_done(struct uv__work *, int)");
  }
  **(undefined8 **)(in_RDI + -0x10) = *(undefined8 *)(in_RDI + -0x18);
  *(undefined8 *)(*(long *)(in_RDI + -0x18) + 8) = *(undefined8 *)(in_RDI + -0x10);
  uVar1 = *(undefined8 *)(in_RDI + 0x48);
  *(undefined8 *)(in_RDI + 0x48) = 0;
  if (*(long *)(in_RDI + 0x30) == 0) {
    if (*(long *)(in_RDI + 0x40) == 0) {
      if (*(long *)(in_RDI + 0x38) == 0) {
        __assert_fail("0","src/unix/getaddrinfo.c",0x3a,
                      "void uv__getaddrinfo_done(struct uv__work *, int)");
      }
      free(*(void **)(in_RDI + 0x38));
    }
    else {
      free(*(void **)(in_RDI + 0x40));
    }
  }
  else {
    free(*(void **)(in_RDI + 0x30));
  }
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  if (in_ESI == -0x7d) {
    if (*(int *)(in_RDI + 0x50) != 0) {
      __assert_fail("req->retcode == 0","src/unix/getaddrinfo.c",0x41,
                    "void uv__getaddrinfo_done(struct uv__work *, int)");
    }
    *(undefined4 *)(in_RDI + 0x50) = 0xfffff445;
  }
  (**(code **)(in_RDI + 0x28))(in_RDI + -0x28,*(undefined4 *)(in_RDI + 0x50),uVar1);
  return;
}

Assistant:

static void uv__getaddrinfo_done(struct uv__work* w, int status) {
  uv_getaddrinfo_t* req;
  struct addrinfo *res;

  req = container_of(w, uv_getaddrinfo_t, work_req);
  uv__req_unregister(req->loop, req);

  res = req->res;
  req->res = NULL;

  /* See initialization in uv_getaddrinfo(). */
  if (req->hints)
    free(req->hints);
  else if (req->service)
    free(req->service);
  else if (req->hostname)
    free(req->hostname);
  else
    assert(0);

  req->hints = NULL;
  req->service = NULL;
  req->hostname = NULL;

  if (status == -ECANCELED) {
    assert(req->retcode == 0);
    req->retcode = UV_EAI_CANCELED;
  }

  req->cb(req, req->retcode, res);
}